

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O2

void __thiscall DFraggleThinker::DFraggleThinker(DFraggleThinker *this)

{
  DFraggleThinker *pDVar1;
  DRunningScript *pDVar2;
  DFsScript *pDVar3;
  DFsScript *pDVar4;
  
  DThinker::DThinker(&this->super_DThinker,0x67);
  (this->super_DThinker).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_00704f98;
  (this->SpawnedThings).Array = (TObjPtr<AActor> *)0x0;
  (this->SpawnedThings).Most = 0;
  (this->SpawnedThings).Count = 0;
  pDVar1 = GC::ReadBarrier<DFraggleThinker>((DFraggleThinker **)&ActiveThinker);
  if (pDVar1 == (DFraggleThinker *)0x0) {
    ActiveThinker.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DFraggleThinker>_1)this;
    pDVar2 = (DRunningScript *)DObject::operator_new(0xd8);
    DRunningScript::DRunningScript(pDVar2,(AActor *)0x0,(DFsScript *)0x0,0);
    (this->RunningScripts).field_0.p = pDVar2;
    pDVar3 = (DFsScript *)DObject::operator_new(0x960);
    DFsScript::DFsScript(pDVar3);
    (this->LevelScript).field_0.p = pDVar3;
    pDVar3 = global_script;
    pDVar4 = GC::ReadBarrier<DFsScript>((DFsScript **)&this->LevelScript);
    (pDVar4->parent).field_0.p = pDVar3;
    pDVar2 = GC::ReadBarrier<DRunningScript>((DRunningScript **)&this->RunningScripts);
    GC::WriteBarrier((DObject *)this,&pDVar2->super_DObject);
    pDVar3 = GC::ReadBarrier<DFsScript>((DFsScript **)&this->LevelScript);
    GC::WriteBarrier((DObject *)this,&pDVar3->super_DObject);
    this->nocheckposition = false;
  }
  else {
    I_Error("Only one FraggleThinker is allowed to exist at a time.\nCheck your code.");
  }
  return;
}

Assistant:

DFraggleThinker::DFraggleThinker() 
: DThinker(STAT_SCRIPTS)
{
	if (ActiveThinker)
	{
		I_Error ("Only one FraggleThinker is allowed to exist at a time.\nCheck your code.");
	}
	else
	{
		ActiveThinker = this;
		RunningScripts = new DRunningScript;
		LevelScript = new DFsScript;
		LevelScript->parent = global_script;
		GC::WriteBarrier(this, RunningScripts);
		GC::WriteBarrier(this, LevelScript);
		nocheckposition = false;
	}
}